

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosine_window.cc
# Opt level: O3

void __thiscall
sptk::CosineWindow::CosineWindow
          (CosineWindow *this,int window_length,vector<double,_std::allocator<double>_> *alpha,
          bool periodic)

{
  double dVar1;
  pointer pdVar2;
  double dVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__CosineWindow_00111d08;
  this->window_length_ = window_length;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) ||
     ((alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    this->is_valid_ = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(&this->window_,(ulong)(uint)window_length);
    iVar9 = this->window_length_;
    if (iVar9 == 1) {
      *(this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else if (0 < iVar9) {
      iVar4 = iVar9 - (this->periodic_ ^ 1);
      pdVar2 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (uint)((ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(alpha->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar5 = 0;
      do {
        dVar10 = *(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (1 < (int)uVar7) {
          iVar9 = -1;
          uVar6 = 1;
          uVar8 = uVar5 & 0xffffffff;
          do {
            dVar1 = (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
            dVar3 = cos((double)(int)uVar8 * (6.283185307179586 / (double)iVar4));
            dVar10 = dVar10 + dVar3 * (double)iVar9 * dVar1;
            iVar9 = -iVar9;
            uVar6 = uVar6 + 1;
            uVar8 = (ulong)(uint)((int)uVar8 + (int)uVar5);
          } while ((uVar7 & 0x7fffffff) != uVar6);
          iVar9 = this->window_length_;
        }
        pdVar2[uVar5] = dVar10;
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)iVar9);
    }
  }
  return;
}

Assistant:

CosineWindow::CosineWindow(int window_length, const std::vector<double>& alpha,
                           bool periodic)
    : window_length_(window_length), periodic_(periodic), is_valid_(true) {
  if (window_length_ <= 0 || alpha.empty()) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length_);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const int alpha_size(static_cast<int>(alpha.size()));
  const double m(kTwoPi / (periodic_ ? window_length_ : window_length_ - 1));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    double sum(alpha[0]);
    int sign(-1);
    for (int k(1); k < alpha_size; ++k) {
      sum += sign * alpha[k] * std::cos(i * k * m);
      sign *= -1;
    }
    window[i] = sum;
  }
}